

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  ostream *poVar1;
  KINT32 Value;
  string local_1f0 [32];
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  VariableDatum *local_18;
  VariableDatum *this_local;
  
  local_18 = this;
  this_local = (VariableDatum *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Variable Datum:");
  poVar1 = std::operator<<(poVar1,"\n\tID:          ");
  ENUMS::GetEnumAsStringDatumID_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)this->m_ui32DatumID,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tLength:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32DatumLength);
  poVar1 = std::operator<<(poVar1,"\n\tValue(S):    ");
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[0xb])(local_1f0);
  poVar1 = std::operator<<(poVar1,local_1f0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString VariableDatum::GetAsString() const
{
    KStringStream ss;

    // For now we return the datum value as a string.
    ss << "Variable Datum:"
       << "\n\tID:          " << GetEnumAsStringDatumID( m_ui32DatumID )
       << "\n\tLength:      " << m_ui32DatumLength
       << "\n\tValue(S):    " << GetDatumValueAsKString()
       << "\n";

    return ss.str();
}